

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

int mod2sparse_write(FILE *f,mod2sparse *m)

{
  int iVar1;
  uint uVar2;
  mod2entry *pmVar3;
  long lVar4;
  
  intio_write(f,m->n_rows);
  iVar1 = ferror((FILE *)f);
  uVar2 = 0;
  if (iVar1 == 0) {
    intio_write(f,m->n_cols);
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      if (0 < m->n_rows) {
        lVar4 = 0;
        do {
          pmVar3 = m->rows[lVar4].right;
          if (-1 < pmVar3->row) {
            intio_write(f,~(uint)lVar4);
            iVar1 = ferror((FILE *)f);
            if (iVar1 != 0) {
              return 0;
            }
            for (; -1 < pmVar3->row; pmVar3 = pmVar3->right) {
              intio_write(f,pmVar3->col + 1);
              iVar1 = ferror((FILE *)f);
              if (iVar1 != 0) {
                return 0;
              }
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < m->n_rows);
      }
      intio_write(f,0);
      iVar1 = ferror((FILE *)f);
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

int mod2sparse_write
( FILE *f,
  mod2sparse *m
)
{
  mod2entry *e;
  int i;

  intio_write(f,m->n_rows);
  if (ferror(f)) return 0;

  intio_write(f,m->n_cols);
  if (ferror(f)) return 0;

  for (i = 0; i<mod2sparse_rows(m); i++)
  { 
    e = mod2sparse_first_in_row(m,i);

    if (!mod2sparse_at_end(e))
    {
      intio_write (f, -(i+1));
      if (ferror(f)) return 0;

      while (!mod2sparse_at_end(e))
      { 
        intio_write (f, mod2sparse_col(e)+1);
        if (ferror(f)) return 0;

        e = mod2sparse_next_in_row(e);
      }
    }
  }

  intio_write(f,0);
  if (ferror(f)) return 0;

  return 1;
}